

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satClause.h
# Opt level: O1

int Sat_MemCompactLearned(Sat_Mem_t *p,int fDoMove)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  byte bVar6;
  int **ppiVar7;
  uint *__src;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint *puVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  
  bVar6 = (byte)p->nPageSize;
  uVar3 = p->iPage[1] << (bVar6 & 0x1f) | *p->pPages[p->iPage[1]];
  uVar8 = 1 << (p->nPageSize & 0x1fU) | 2;
  if (uVar3 == uVar8) {
    return 0;
  }
  uVar10 = 0;
  if ((fDoMove == 0) || (uVar14 = p->BookMarkH[1], uVar14 == 0)) {
LAB_008e1dd8:
    puVar11 = (uint *)0x0;
  }
  else {
    if (((int)uVar14 < (int)uVar8) || ((int)uVar3 < (int)uVar14)) {
      __assert_fail("p->BookMarkH[1] >= Sat_MemHand(p, 1, 2) && p->BookMarkH[1] <= hLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                    ,0x179,"int Sat_MemCompactLearned(Sat_Mem_t *, int)");
    }
    uVar8 = p->uPageMask & uVar14;
    if (uVar8 == 0) goto LAB_008e20ed;
    puVar11 = (uint *)(p->pPages[(int)uVar14 >> (bVar6 & 0x1f)] + (int)uVar8);
    if (((int)uVar14 < (int)uVar3) && ((*puVar11 & 2) == 0)) {
      p->BookMarkH[1] = puVar11[(ulong)(*puVar11 >> 0xb) + 1];
      goto LAB_008e1dd8;
    }
  }
  if (p->iPage[1] < 1) {
    uVar8 = 2;
    uVar3 = 1;
  }
  else {
    uVar8 = 2;
    uVar10 = 0;
    uVar9 = 1;
    bVar2 = false;
    uVar3 = 1;
    do {
      ppiVar7 = p->pPages;
      if (2 < *ppiVar7[uVar9]) {
        uVar13 = 2;
        do {
          if (ppiVar7[uVar9] == (int *)0x0) break;
          __src = (uint *)(ppiVar7[uVar9] + uVar13);
          uVar14 = *__src;
          if ((uVar14 & 1) == 0) {
            __assert_fail("c->lrn",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                          ,0x187,"int Sat_MemCompactLearned(Sat_Mem_t *, int)");
          }
          if ((uVar14 & 2) == 0) {
            if (bVar2) {
              p->BookMarkH[1] = __src[(ulong)(uVar14 >> 0xb) + 1];
            }
            uVar14 = (*__src >> 0xb) + (*__src & 1) + 2 & 0xfffffffe;
            if (1 << ((byte)p->nPageSize & 0x1f) <= (int)(uVar14 + uVar8)) {
              if (fDoMove != 0) {
                *ppiVar7[(int)uVar3] = uVar8;
              }
              uVar3 = uVar3 + 2;
              uVar8 = 2;
            }
            lVar12 = (long)(int)uVar3;
            if (fDoMove == 0) {
              uVar4 = uVar3 << ((byte)p->nPageSize & 0x1f) | uVar8;
            }
            else {
              if (__src[(ulong)(*__src >> 0xb) + 1] !=
                  (uVar3 << ((byte)p->nPageSize & 0x1f) | uVar8)) {
                __assert_fail("c->lits[c->size] == Sat_MemHand(p, iNew, kNew)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                              ,0x1a9,"int Sat_MemCompactLearned(Sat_Mem_t *, int)");
              }
              uVar4 = uVar10;
              if ((uVar9 != uVar3) || ((uint)uVar13 != uVar8)) {
                memmove(ppiVar7[lVar12] + (int)uVar8,__src,(ulong)(uVar14 * 4));
                uVar1 = p->pPages[lVar12][(int)uVar8];
                if (uVar14 != ((uVar1 & 1) + (uVar1 >> 0xb) + 2 & 0xfffffffe)) {
                  __assert_fail("nInts == Sat_MemClauseSize(c)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                                ,0x1b0,"int Sat_MemCompactLearned(Sat_Mem_t *, int)");
                }
                __src = (uint *)(p->pPages[lVar12] + (int)uVar8);
              }
            }
            __src[(ulong)(*__src >> 0xb) + 1] = uVar4;
            if (((long)uVar9 < lVar12) ||
               (uVar8 = uVar8 + uVar14, 1 << ((byte)p->nPageSize & 0x1f) <= (int)uVar8)) {
              __assert_fail("iNew <= i && kNew < (1 << p->nPageSize)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                            ,0x1b9,"int Sat_MemCompactLearned(Sat_Mem_t *, int)");
            }
            uVar10 = uVar10 + 1;
            bVar2 = false;
          }
          else if (puVar11 == (uint *)0x0) {
            puVar11 = (uint *)0x0;
          }
          else if (puVar11 == __src) {
            puVar11 = (uint *)0x0;
            bVar2 = true;
          }
          uVar14 = (uint)uVar13 + ((*__src & 1) + (*__src >> 0xb) + 2 & 0xfffffffe);
          uVar13 = (ulong)uVar14;
          ppiVar7 = p->pPages;
        } while ((int)uVar14 < *ppiVar7[uVar9]);
      }
      uVar9 = uVar9 + 2;
    } while ((int)uVar9 <= p->iPage[1]);
  }
  if (fDoMove != 0) {
    p->nEntries[1] = uVar10;
    p->iPage[1] = uVar3;
    ppiVar7 = p->pPages;
    *ppiVar7[(int)uVar3] = uVar8;
    uVar3 = p->BookMarkH[1];
    if (uVar3 != 0) {
      if (puVar11 == (uint *)0x0) {
        uVar8 = p->uPageMask & uVar3;
        if (uVar8 == 0) {
LAB_008e20ed:
          __assert_fail("k",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                        ,0x61,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
        }
        piVar5 = ppiVar7[(int)uVar3 >> ((byte)p->nPageSize & 0x1f)] + (int)uVar8 +
                 (ulong)((uint)ppiVar7[(int)uVar3 >> ((byte)p->nPageSize & 0x1f)][(int)uVar8] >> 0xb
                        ) + 1;
      }
      else {
        piVar5 = p->nEntries + 1;
        p->BookMarkH[1] = p->iPage[1] << ((byte)p->nPageSize & 0x1f) | *ppiVar7[p->iPage[1]];
      }
      p->BookMarkE[1] = *piVar5;
    }
  }
  return uVar10;
}

Assistant:

static inline int Sat_MemCompactLearned( Sat_Mem_t * p, int fDoMove )
{
    clause * c, * cPivot = NULL;
    int i, k, iNew = 1, kNew = 2, nInts, fStartLooking, Counter = 0;
    int hLimit = Sat_MemHandCurrent(p, 1);
    if ( hLimit == Sat_MemHand(p, 1, 2) )
        return 0;
    if ( fDoMove && p->BookMarkH[1] )
    {
        // move the pivot
        assert( p->BookMarkH[1] >= Sat_MemHand(p, 1, 2) && p->BookMarkH[1] <= hLimit );
        // get the pivot and remember it may be pointed offlimit
        cPivot = Sat_MemClauseHand( p, p->BookMarkH[1] );
        if ( p->BookMarkH[1] < hLimit && !cPivot->mark )
        {
            p->BookMarkH[1] = cPivot->lits[cPivot->size];
            cPivot = NULL;
        }
        // else find the next used clause after cPivot
    }
    // iterate through the learned clauses
    fStartLooking = 0;
    Sat_MemForEachLearned( p, c, i, k )
    {
        assert( c->lrn );
        // skip marked entry
        if ( c->mark )
        {
            // if pivot is a marked clause, start looking for the next non-marked one
            if ( cPivot && cPivot == c )
            {
                fStartLooking = 1;
                cPivot = NULL;
            }
            continue;
        }
        // if we started looking before, we found it!
        if ( fStartLooking )
        {
            fStartLooking = 0;
            p->BookMarkH[1] = c->lits[c->size];
        }
        // compute entry size
        nInts = Sat_MemClauseSize(c);
        assert( !(nInts & 1) );
        // check if we need to scroll to the next page
        if ( kNew + nInts >= (1 << p->nPageSize) )
        {
            // set the limit of the current page
            if ( fDoMove )
                Sat_MemWriteLimit( p->pPages[iNew], kNew );
            // move writing position to the new page
            iNew += 2;
            kNew = 2;
        }
        if ( fDoMove )
        {
            // make sure the result is the same as previous dry run
            assert( c->lits[c->size] == Sat_MemHand(p, iNew, kNew) );
            // only copy the clause if it has changed
            if ( i != iNew || k != kNew )
            {
                memmove( p->pPages[iNew] + kNew, c, sizeof(int) * nInts );
//                c = Sat_MemClause( p, iNew, kNew ); // assersions do not hold during dry run
                c = (clause *)(p->pPages[iNew] + kNew);
                assert( nInts == Sat_MemClauseSize(c) );
            }
            // set the new ID value
            c->lits[c->size] = Counter;
        }
        else // remember the address of the clause in the new location
            c->lits[c->size] = Sat_MemHand(p, iNew, kNew);
        // update writing position
        kNew += nInts;
        assert( iNew <= i && kNew < (1 << p->nPageSize) );
        // update counter
        Counter++;
    }
    if ( fDoMove )
    {
        // update the counter
        p->nEntries[1] = Counter;
        // update the page count
        p->iPage[1] = iNew;
        // set the limit of the last page
        Sat_MemWriteLimit( p->pPages[iNew], kNew );
        // check if the pivot need to be updated
        if ( p->BookMarkH[1] )
        {
            if ( cPivot )
            {
                p->BookMarkH[1] = Sat_MemHandCurrent(p, 1);
                p->BookMarkE[1] = p->nEntries[1];
            }
            else
                p->BookMarkE[1] = clause_id(Sat_MemClauseHand( p, p->BookMarkH[1] ));
        }

    }
    return Counter;
}